

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManComputeForwardObj(Of_Man_t *p,int iObj)

{
  int iVar1;
  int *pCutSet;
  int Delay1This;
  int *pList;
  int *pCutMin;
  int *pCut;
  int local_18;
  int i;
  int Delay1;
  int iObj_local;
  Of_Man_t *p_local;
  
  local_18 = 1000000000;
  pList = (int *)0x0;
  pCutSet = Of_ObjCutSet(p,iObj);
  pCut._4_4_ = 0;
  pCutMin = pCutSet + 1;
  while (pCut._4_4_ < *pCutSet) {
    iVar1 = Of_ManComputeForwardCut(p,iObj,pCutMin);
    if (iVar1 < local_18) {
      pList = pCutMin;
      local_18 = iVar1;
    }
    pCut._4_4_ = pCut._4_4_ + 1;
    iVar1 = Of_CutSize(pCutMin);
    pCutMin = pCutMin + (iVar1 + 4);
  }
  iVar1 = Of_ObjRefNum(p,iObj);
  if (iVar1 != 0) {
    pList = Of_ObjCutBestP(p,iObj);
  }
  Of_ObjSetCutBestP(p,pCutSet,iObj,pList);
  iVar1 = Of_CutDelay1(pList);
  Of_ObjSetDelay1(p,iObj,iVar1);
  if (p->Iter != 0) {
    iVar1 = Of_ManComputeForwardCutArea(p,iObj,pList);
    Of_ObjSetFlow(p,iObj,iVar1);
  }
  return;
}

Assistant:

static inline void Of_ManComputeForwardObj( Of_Man_t * p, int iObj )
{
    int Delay1 = ABC_INFINITY;
    int i, * pCut, * pCutMin = NULL, * pList = Of_ObjCutSet(p, iObj);
    // compute cut arrivals
    Of_SetForEachCut( pList, pCut, i )
    {
        int Delay1This = Of_ManComputeForwardCut(p, iObj, pCut);
        if ( Delay1 > Delay1This )
        {
            Delay1  = Delay1This;
            pCutMin = pCut;
        }
    }
    // if mapping is present, set object arrival equal to cut arrival
    if ( Of_ObjRefNum(p, iObj) )
        pCutMin = Of_ObjCutBestP(p, iObj);
    Of_ObjSetCutBestP( p, pList, iObj, pCutMin );
    Of_ObjSetDelay1( p, iObj, Of_CutDelay1(pCutMin) );
    if ( p->Iter )
        Of_ObjSetFlow( p, iObj, Of_ManComputeForwardCutArea(p, iObj, pCutMin) );
}